

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengineex.cpp
# Opt level: O2

void __thiscall QPaintEngineEx::stroke(QPaintEngineEx *this,QVectorPath *path,QPen *inPen)

{
  QStroker *this_00;
  QPointF *pQVar1;
  ElementType EVar2;
  QPaintEnginePrivate *pQVar3;
  QRegionData *pQVar4;
  double dVar5;
  double dVar6;
  uint uVar7;
  bool bVar8;
  PenStyle PVar9;
  int iVar10;
  PenJoinStyle PVar11;
  LineJoinMode LVar12;
  PenCapStyle PVar13;
  uint uVar14;
  TransformationType TVar15;
  StrokeHandler *this_01;
  undefined1 *puVar16;
  long lVar17;
  undefined1 *puVar18;
  QPaintEngineState *pQVar19;
  QPaintEngineState *pQVar20;
  qreal *pqVar21;
  QTransform *pQVar22;
  QStrokerOps *pQVar23;
  QRectF *pQVar24;
  QStroker *pQVar25;
  ElementType *pEVar26;
  QVectorPath *this_02;
  QPointF *p;
  QPointF *pQVar27;
  QBrush *this_03;
  long in_FS_OFFSET;
  byte bVar28;
  ulong uVar29;
  qreal qVar30;
  _func_int **pp_Var31;
  double dVar32;
  qreal qVar33;
  double dVar34;
  QColor QVar35;
  QPointF QVar36;
  QPointF QVar37;
  QPointF QVar38;
  QBrush brush;
  QPen pen;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  QVectorPath local_168;
  QRectF local_128 [2];
  QPainterPath painterPath;
  double dStack_d0;
  QTransform local_88;
  long local_38;
  
  bVar28 = 0;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (path->m_points == (qreal *)0x0) goto LAB_0037e9f4;
  pQVar3 = (this->super_QPaintEngine).d_ptr.d;
  if (pQVar3[3].baseSystemClip.d == (QRegionData *)0x0) {
    this_01 = (StrokeHandler *)operator_new(0x30);
    StrokeHandler::StrokeHandler(this_01,path->m_count + 4);
    pQVar3[3].baseSystemClip.d = (QRegionData *)this_01;
    pQVar3[1].systemTransform.m_matrix[1][0] = (qreal)qpaintengineex_moveTo;
    pQVar3[1].systemTransform.m_matrix[1][1] = (qreal)qpaintengineex_lineTo;
    pQVar3[1].systemTransform.m_matrix[1][2] = (qreal)qpaintengineex_cubicTo;
  }
  local_178 = (undefined1  [16])0x0;
  local_188 = (undefined1  [16])0x0;
  pen.d.d.ptr = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  QPen::QPen(&pen,inPen);
  PVar9 = QPen::style(&pen);
  if (1 < (int)PVar9) {
    painterPath.d_ptr.d.ptr =
         (QExplicitlySharedDataPointer<QPainterPathPrivate>)
         (totally_ordered_wrapper<QPainterPathPrivate_*>)0xffffffffffffffff;
    dStack_d0 = -NAN;
    QVectorPath::controlPointRect(path);
    pQVar20 = (this->super_QPaintEngine).state;
    pQVar19 = pQVar20 + -2;
    if (pQVar20 == (QPaintEngineState *)0x0) {
      pQVar19 = (QPaintEngineState *)0x0;
    }
    bVar8 = QPen::isCosmetic(&pen);
    if (bVar8) {
      QRectF::QRectF((QRectF *)&local_88,(QRect *)&pQVar3[3].systemRect.x2);
      local_178._4_4_ = local_88.m_matrix[0][2]._4_4_;
      local_178._0_4_ = local_88.m_matrix[0][2]._0_4_;
      local_178._12_4_ = local_88.m_matrix[1][0]._4_4_;
      local_178._8_4_ = local_88.m_matrix[1][0]._0_4_;
      local_188._8_8_ = local_88.m_matrix[0][1];
      local_188._0_8_ = local_88.m_matrix[0][0];
      painterPath.d_ptr.d.ptr =
           (QExplicitlySharedDataPointer<QPainterPathPrivate>)
           (*(double *)(pQVar19 + 0x42) + (double)painterPath.d_ptr.d.ptr);
      dStack_d0 = *(double *)(pQVar19 + 0x44) + -NAN;
    }
    else {
      QTransform::inverted(&local_88,(QTransform *)(pQVar19 + 0x36),(bool *)0x0);
      QRectF::QRectF((QRectF *)&local_168,(QRect *)&pQVar3[3].systemRect.x2);
      QTransform::mapRect(local_128,&local_88,(QRectF *)&local_168);
      local_178._8_8_ = local_128[0].h;
      local_178._0_8_ = local_128[0].w;
      local_188._8_8_ = local_128[0].yp;
      local_188._0_8_ = local_128[0].xp;
    }
    qVar30 = QPen::widthF(&pen);
    if ((qVar30 != 0.0) || (NAN(qVar30))) {
      qVar30 = QPen::widthF(&pen);
    }
    else {
      qVar30 = 1.0;
    }
    local_88.m_matrix[0][2]._0_4_ = -1;
    local_88.m_matrix[0][2]._4_4_ = 0xffffffff;
    local_88.m_matrix[1][0]._0_4_ = 0xffffffff;
    local_88.m_matrix[1][0]._4_4_ = 0xffffffff;
    local_88.m_matrix[0][0] = -NAN;
    local_88.m_matrix[0][1] = -NAN;
    local_128[0].xp = (double)painterPath.d_ptr.d.ptr - qVar30;
    local_128[0].yp = dStack_d0 - qVar30;
    local_128[0].w = qVar30 + -NAN + qVar30;
    local_128[0].h = qVar30 + -NAN + qVar30;
    QRectF::operator&((QRectF *)&local_88,(QRectF *)local_128);
    dVar6 = (double)CONCAT44(local_88.m_matrix[0][2]._4_4_,local_88.m_matrix[0][2]._0_4_);
    dVar34 = (double)CONCAT44(local_88.m_matrix[1][0]._4_4_,local_88.m_matrix[1][0]._0_4_);
    local_128[0].w = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_128[0].xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    local_128[0].yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    QPen::dashPattern((QList<double> *)local_128,&pen);
    puVar16 = (undefined1 *)0x20;
    if ((ulong)local_128[0].w < (undefined1 *)0x20) {
      puVar16 = (undefined1 *)local_128[0].w;
    }
    dVar32 = 0.0;
    for (puVar18 = (undefined1 *)0x0; puVar16 != puVar18; puVar18 = puVar18 + 1) {
      dVar5 = 0.0;
      if (0.0 <= *(double *)((long)local_128[0].yp + (long)puVar18 * 8)) {
        dVar5 = *(double *)((long)local_128[0].yp + (long)puVar18 * 8);
      }
      dVar32 = dVar32 + dVar5;
    }
    dVar32 = qVar30 * dVar32;
    uVar29 = -(ulong)(dVar32 < -dVar32);
    if ((double)(~uVar29 & (ulong)dVar32 | (ulong)-dVar32 & uVar29) <= 1e-12) {
      QPen::setStyle(&pen,NoPen);
    }
    else {
      if (dVar34 <= dVar6) {
        dVar34 = dVar6;
      }
      if (10000.0 < dVar34 / dVar32) {
        QPen::setStyle(&pen,SolidLine);
        local_168.m_elements = (ElementType *)&DAT_aaaaaaaaaaaaaaaa;
        local_168.m_points = (qreal *)&DAT_aaaaaaaaaaaaaaaa;
        QVar35 = QPen::color(&pen);
        local_168.m_elements = QVar35._0_8_;
        local_168.m_points._0_6_ = QVar35.ct._4_6_;
        iVar10 = QColor::alpha((QColor *)&local_168);
        QColor::setAlpha((QColor *)&local_168,iVar10 / 2);
        QPen::setColor(&pen,(QColor *)&local_168);
      }
    }
    QArrayDataPointer<double>::~QArrayDataPointer((QArrayDataPointer<double> *)local_128);
  }
  if (pen.d.d.ptr ==
      (totally_ordered_wrapper<QPenPrivate_*>)
      *(totally_ordered_wrapper<QPenPrivate_*> *)&pQVar3[3].systemRect) {
    pQVar25 = (QStroker *)pQVar3[3].systemClip.d;
    if (pQVar25 != (QStroker *)0x0) goto LAB_0037e2af;
  }
  else {
    QPen::operator=((QPen *)&pQVar3[3].systemRect,&pen);
    PVar11 = QPen::joinStyle(&pen);
    LVar12 = QStroker::joinModeForJoin(PVar11);
    *(LineJoinMode *)((long)pQVar3[1].systemTransform.m_matrix[2] + 0x14) = LVar12;
    PVar13 = QPen::capStyle(&pen);
    LVar12 = QStroker::joinModeForCap(PVar13);
    *(LineJoinMode *)(pQVar3[1].systemTransform.m_matrix[2] + 2) = LVar12;
    qVar30 = QPen::miterLimit(&pen);
    pQVar3[1].systemTransform.m_matrix[2][1] = qVar30;
    qVar30 = QPen::widthF(&pen);
    if ((qVar30 != 0.0) || (NAN(qVar30))) {
      dVar34 = 1.0 / qVar30;
      bVar8 = 0.25 < dVar34;
      if (dVar34 <= 0.00025) {
        dVar34 = 0.00025;
      }
      qVar33 = (qreal)(-(ulong)bVar8 & 0x3fd0000000000000 | ~-(ulong)bVar8 & (ulong)dVar34);
    }
    else {
      qVar33 = 0.25;
      qVar30 = 1.0;
    }
    pQVar3[1].systemTransform.m_matrix[2][0] = qVar30;
    pQVar3[1].systemTransform.m_matrix[0][0] = qVar33;
    PVar9 = QPen::style(&pen);
    if (PVar9 == SolidLine) {
      pQVar25 = (QStroker *)(pQVar3 + 1);
    }
    else {
      if (PVar9 == NoPen) {
        pQVar3[3].systemClip.d = (QRegionData *)0x0;
        goto LAB_0037e9ea;
      }
      pQVar25 = (QStroker *)&pQVar3[2].q_ptr;
      QPen::dashPattern((QList<double> *)&local_88,&pen);
      QArrayDataPointer<double>::operator=
                ((QArrayDataPointer<double> *)&pQVar3[2].systemTransform.field_0x48,
                 (QArrayDataPointer<double> *)&local_88);
      QArrayDataPointer<double>::~QArrayDataPointer((QArrayDataPointer<double> *)&local_88);
      pp_Var31 = (_func_int **)QPen::dashOffset(&pen);
      pQVar3[3]._vptr_QPaintEnginePrivate = pp_Var31;
    }
    pQVar3[3].systemClip.d = (QRegionData *)pQVar25;
LAB_0037e2af:
    if (((((double)local_178._0_8_ != 0.0) || (NAN((double)local_178._0_8_))) ||
        ((double)local_178._8_8_ != 0.0)) || (NAN((double)local_178._8_8_))) {
      (pQVar25->super_QStrokerOps).m_clip_rect.w = (qreal)local_178._0_8_;
      (pQVar25->super_QStrokerOps).m_clip_rect.h = (qreal)local_178._8_8_;
      (pQVar25->super_QStrokerOps).m_clip_rect.xp = (qreal)local_188._0_8_;
      (pQVar25->super_QStrokerOps).m_clip_rect.yp = (qreal)local_188._8_8_;
      pQVar25 = (QStroker *)pQVar3[3].systemClip.d;
    }
    this_00 = (QStroker *)(pQVar3 + 1);
    if (pQVar25 == this_00) {
      *(byte *)&pQVar3[2].pdev = (byte)(path->m_hints >> 0xf) & 1;
    }
    pEVar26 = path->m_elements;
    p = (QPointF *)path->m_points;
    iVar10 = path->m_count;
    pQVar4 = pQVar3[3].baseSystemClip.d;
    *(undefined8 *)(pQVar4 + 2) = 0;
    pQVar4->qt_rgn = (QRegionPrivate *)0x0;
    uVar14 = (uint)(2 < iVar10) * 2 + 0x2000;
    PVar13 = QStroker::capStyle(this_00);
    if ((PVar13 == RoundCap) || (PVar11 = QStroker::joinStyle(this_00), PVar11 == RoundJoin)) {
      uVar14 = uVar14 | 4;
    }
    pQVar1 = (QPointF *)(&p->xp + iVar10 * 2);
    bVar8 = QPen::isCosmetic(&pen);
    if (bVar8) {
      pQVar20 = (this->super_QPaintEngine).state;
      pQVar19 = pQVar20 + -2;
      if (pQVar20 == (QPaintEngineState *)0x0) {
        pQVar19 = (QPaintEngineState *)0x0;
      }
      TVar15 = QTransform::type((QTransform *)(pQVar19 + 0x36));
      if ((int)TVar15 < 0x10) {
        pQVar23 = (QStrokerOps *)pQVar3[3].systemClip.d;
        pqVar21 = (qreal *)&DAT_005edf68;
        pQVar22 = &local_88;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          pQVar22->m_matrix[0][0] = *pqVar21;
          pqVar21 = pqVar21 + (ulong)bVar28 * -2 + 1;
          pQVar22 = (QTransform *)((long)pQVar22 + ((ulong)bVar28 * -2 + 1) * 8);
        }
        local_88._72_2_ = local_88._72_2_ & 0xfc00;
        QStrokerOps::setCurveThresholdFromTransform(pQVar23,&local_88);
        pQVar4 = pQVar3[3].systemClip.d;
        (**(code **)(*(long *)pQVar4 + 0x10))(pQVar4,pQVar3[3].baseSystemClip.d);
        uVar7 = uVar14;
        if (pEVar26 == (ElementType *)0x0) {
          pQVar20 = (this->super_QPaintEngine).state;
          pQVar19 = pQVar20 + -2;
          if (pQVar20 == (QPaintEngineState *)0x0) {
            pQVar19 = (QPaintEngineState *)0x0;
          }
          QVar36 = QTransform::map((QTransform *)(pQVar19 + 0x36),p);
          QStrokerOps::moveTo((QStrokerOps *)pQVar3[3].systemClip.d,QVar36.xp,QVar36.yp);
          while (p = p + 1, p < pQVar1) {
            pQVar20 = (this->super_QPaintEngine).state;
            pQVar19 = pQVar20 + -2;
            if (pQVar20 == (QPaintEngineState *)0x0) {
              pQVar19 = (QPaintEngineState *)0x0;
            }
            QVar37 = QTransform::map((QTransform *)(pQVar19 + 0x36),p);
            QStrokerOps::lineTo((QStrokerOps *)pQVar3[3].systemClip.d,QVar37.xp,QVar37.yp);
          }
          if ((path->m_hints & 0x4000) != 0) {
            pQVar23 = (QStrokerOps *)pQVar3[3].systemClip.d;
LAB_0037e888:
            QStrokerOps::lineTo(pQVar23,QVar36.xp,QVar36.yp);
          }
        }
        else {
LAB_0037e630:
          for (; p < pQVar1; p = p + 3) {
            EVar2 = *pEVar26;
            if (EVar2 != CurveToElement) {
              if (EVar2 != LineToElement) goto code_r0x0037e64b;
              pQVar20 = (this->super_QPaintEngine).state;
              pQVar19 = pQVar20 + -2;
              if (pQVar20 == (QPaintEngineState *)0x0) {
                pQVar19 = (QPaintEngineState *)0x0;
              }
              QVar36 = QTransform::map((QTransform *)(pQVar19 + 0x36),p);
              QStrokerOps::lineTo((QStrokerOps *)pQVar3[3].systemClip.d,QVar36.xp,QVar36.yp);
              goto LAB_0037e761;
            }
            pQVar20 = (this->super_QPaintEngine).state;
            pQVar19 = pQVar20 + -2;
            if (pQVar20 == (QPaintEngineState *)0x0) {
              pQVar19 = (QPaintEngineState *)0x0;
            }
            QVar36 = QTransform::map((QTransform *)(pQVar19 + 0x36),p);
            pQVar19 = (this->super_QPaintEngine).state;
            if (pQVar19 != (QPaintEngineState *)0x0) {
              pQVar19 = pQVar19 + -2;
            }
            QVar37 = QTransform::map((QTransform *)(pQVar19 + 0x36),p + 1);
            pQVar19 = (this->super_QPaintEngine).state;
            if (pQVar19 != (QPaintEngineState *)0x0) {
              pQVar19 = pQVar19 + -2;
            }
            QVar38 = QTransform::map((QTransform *)(pQVar19 + 0x36),p + 2);
            QStrokerOps::cubicTo
                      ((QStrokerOps *)pQVar3[3].systemClip.d,QVar36.xp,QVar36.yp,QVar37.xp,QVar37.yp
                       ,QVar38.xp,QVar38.yp);
            pEVar26 = pEVar26 + 3;
            uVar7 = uVar14 | 4;
          }
          uVar14 = uVar7;
          if ((path->m_hints & 0x4000) != 0) {
            pQVar20 = (this->super_QPaintEngine).state;
            pQVar19 = pQVar20 + -2;
            if (pQVar20 == (QPaintEngineState *)0x0) {
              pQVar19 = (QPaintEngineState *)0x0;
            }
            QVar36 = QTransform::map((QTransform *)(pQVar19 + 0x36),(QPointF *)path->m_points);
            pQVar23 = (QStrokerOps *)pQVar3[3].systemClip.d;
            goto LAB_0037e888;
          }
        }
        (**(code **)(*(long *)pQVar3[3].systemClip.d + 0x18))();
        local_168.m_hints = uVar14;
      }
      else {
        painterPath.d_ptr.d.ptr =
             (QExplicitlySharedDataPointer<QPainterPathPrivate>)&DAT_aaaaaaaaaaaaaaaa;
        pQVar20 = (this->super_QPaintEngine).state;
        pQVar19 = pQVar20 + -2;
        if (pQVar20 == (QPaintEngineState *)0x0) {
          pQVar19 = (QPaintEngineState *)0x0;
        }
        QVectorPath::convertToPainterPath((QVectorPath *)&local_88);
        QTransform::map((QTransform *)&painterPath,(QPainterPath *)(pQVar19 + 0x36));
        QPainterPath::~QPainterPath((QPainterPath *)&local_88);
        pQVar4 = pQVar3[3].baseSystemClip.d;
        pQVar23 = (QStrokerOps *)pQVar3[3].systemClip.d;
        pqVar21 = (qreal *)&DAT_005edf68;
        pQVar22 = &local_88;
        for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
          pQVar22->m_matrix[0][0] = *pqVar21;
          pqVar21 = pqVar21 + (ulong)bVar28 * -2 + 1;
          pQVar22 = (QTransform *)((long)pQVar22 + ((ulong)bVar28 * -2 + 1) * 8);
        }
        local_88._72_2_ = local_88._72_2_ & 0xfc00;
        QStrokerOps::strokePath(pQVar23,&painterPath,pQVar4,&local_88);
        QPainterPath::~QPainterPath(&painterPath);
        local_168.m_hints = uVar14;
      }
      local_168.m_cp_rect.x2._0_4_ = 0xffffffff;
      local_168.m_cp_rect.x2._4_4_ = 0xffffffff;
      local_168.m_cp_rect.y2._0_4_ = 0xffffffff;
      local_168.m_cp_rect.y2._4_4_ = 0xffffffff;
      local_168.m_cp_rect.x1._0_4_ = 0xffffffff;
      local_168.m_cp_rect.x1._4_4_ = 0xffffffff;
      local_168.m_cp_rect.y1._0_4_ = 0xffffffff;
      local_168.m_cp_rect.y1._4_4_ = 0xffffffff;
      local_168.m_cache = (CacheEntry *)&DAT_aaaaaaaaaaaaaaaa;
      pQVar4 = pQVar3[3].baseSystemClip.d;
      local_168.m_points = *(qreal **)(pQVar4 + 1);
      local_168.m_count = pQVar4[2].ref.atomic._q_value.super___atomic_base<int>._M_i;
      local_168.m_elements = (ElementType *)pQVar4[2].qt_rgn;
      pQVar20 = (this->super_QPaintEngine).state;
      pQVar19 = pQVar20 + -2;
      if (pQVar20 == (QPaintEngineState *)0x0) {
        pQVar19 = (QPaintEngineState *)0x0;
      }
      pQVar20 = pQVar19 + 0x36;
      pQVar22 = &local_88;
      for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
        pQVar22->m_matrix[0][0] = *(qreal *)pQVar20;
        pQVar20 = pQVar20 + (ulong)bVar28 * -4 + 2;
        pQVar22 = (QTransform *)((long)pQVar22 + ((ulong)bVar28 * -2 + 1) * 8);
      }
      pqVar21 = (qreal *)&DAT_005edf68;
      pQVar20 = pQVar19 + 0x36;
      for (lVar17 = 9; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(qreal *)pQVar20 = *pqVar21;
        pqVar21 = pqVar21 + (ulong)bVar28 * -2 + 1;
        pQVar20 = pQVar20 + (ulong)bVar28 * -4 + 2;
      }
      *(undefined2 *)
       &pQVar19[0x48].dirtyFlags.super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
        super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = 0;
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x27])(this);
      brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
      super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
      super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
      QPen::brush((QPen *)&brush);
      if (*(int *)((long)brush.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>.
                         _M_t.super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                         super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) != 1) {
        pqVar21 = (qreal *)((long)brush.d._M_t.
                                  super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                                  super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                                  super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 0x18);
        pQVar24 = local_128;
        for (lVar17 = 10; lVar17 != 0; lVar17 = lVar17 + -1) {
          (*(qreal (*) [3])&pQVar24->xp)[0] = *pqVar21;
          pqVar21 = pqVar21 + (ulong)bVar28 * -2 + 1;
          pQVar24 = (QRectF *)((long)pQVar24 + ((ulong)bVar28 * -2 + 1) * 8);
        }
        QTransform::operator*((QTransform *)&painterPath,(QTransform *)local_128,&local_88);
        QBrush::setTransform(&brush,(QTransform *)&painterPath);
      }
      this_02 = &local_168;
      this_03 = &brush;
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,this_02,this_03);
      pQVar20 = (this->super_QPaintEngine).state;
      pQVar19 = pQVar20 + -2;
      if (pQVar20 == (QPaintEngineState *)0x0) {
        pQVar19 = (QPaintEngineState *)0x0;
      }
      pQVar22 = &local_88;
      pQVar19 = pQVar19 + 0x36;
      for (lVar17 = 0x4a; lVar17 != 0; lVar17 = lVar17 + -1) {
        *(undefined1 *)
         &(pQVar19->dirtyFlags).super_QFlagsStorageHelper<QPaintEngine::DirtyFlag,_4>.
          super_QFlagsStorage<QPaintEngine::DirtyFlag>.i = *(undefined1 *)pQVar22->m_matrix[0];
        pQVar22 = (QTransform *)((long)pQVar22 + (ulong)bVar28 * -2 + 1);
        pQVar19 = (QPaintEngineState *)((long)pQVar19 + (ulong)bVar28 * -2 + 1);
      }
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x27])(this);
    }
    else {
      pQVar20 = (this->super_QPaintEngine).state;
      pQVar19 = pQVar20 + -2;
      if (pQVar20 == (QPaintEngineState *)0x0) {
        pQVar19 = (QPaintEngineState *)0x0;
      }
      QStrokerOps::setCurveThresholdFromTransform
                ((QStrokerOps *)pQVar3[3].systemClip.d,(QTransform *)(pQVar19 + 0x36));
      pQVar4 = pQVar3[3].systemClip.d;
      (**(code **)(*(long *)pQVar4 + 0x10))(pQVar4,pQVar3[3].baseSystemClip.d);
      uVar7 = uVar14;
      if (pEVar26 == (ElementType *)0x0) {
        QStrokerOps::moveTo((QStrokerOps *)pQVar3[3].systemClip.d,p->xp,p->yp);
        while (pQVar27 = p + 1, pQVar27 < pQVar1) {
          QStrokerOps::lineTo((QStrokerOps *)pQVar3[3].systemClip.d,pQVar27->xp,p[1].yp);
          p = pQVar27;
        }
        bVar28 = *(byte *)((long)&path->m_hints + 1);
      }
      else {
LAB_0037e48c:
        for (; p < pQVar1; p = p + 3) {
          EVar2 = *pEVar26;
          if (EVar2 != CurveToElement) {
            if (EVar2 != LineToElement) goto code_r0x0037e4a3;
            QStrokerOps::lineTo((QStrokerOps *)pQVar3[3].systemClip.d,p->xp,p->yp);
            goto LAB_0037e515;
          }
          QStrokerOps::cubicTo
                    ((QStrokerOps *)pQVar3[3].systemClip.d,p->xp,p->yp,p[1].xp,p[1].yp,p[2].xp,
                     p[2].yp);
          pEVar26 = pEVar26 + 3;
          uVar7 = uVar14 | 4;
        }
        bVar28 = *(byte *)((long)&path->m_hints + 1);
        uVar14 = uVar7;
      }
      if ((bVar28 & 0x40) != 0) {
        QStrokerOps::lineTo((QStrokerOps *)pQVar3[3].systemClip.d,*path->m_points,path->m_points[1])
        ;
      }
      (**(code **)(*(long *)pQVar3[3].systemClip.d + 0x18))();
      pQVar4 = pQVar3[3].baseSystemClip.d;
      if (*(long *)(pQVar4 + 2) == 0) goto LAB_0037e9ea;
      this_02 = (QVectorPath *)&local_88;
      local_88.m_matrix[1][2]._0_4_ = 0xffffffff;
      local_88.m_matrix[1][2]._4_4_ = 0xffffffff;
      local_88.m_matrix[2][0]._0_4_ = 0xffffffff;
      local_88.m_matrix[2][0]._4_4_ = 0xffffffff;
      local_88.m_matrix[1][0]._0_4_ = 0xffffffff;
      local_88.m_matrix[1][0]._4_4_ = 0xffffffff;
      local_88.m_matrix[1][1]._0_4_ = 0xffffffff;
      local_88.m_matrix[1][1]._4_4_ = 0xffffffff;
      local_88.m_matrix[2][1] = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      local_88.m_matrix[0][1] = *(qreal *)(pQVar4 + 1);
      local_88.m_matrix[0][0] = (qreal)pQVar4[2].qt_rgn;
      local_88.m_matrix[0][2]._0_4_ = (int)*(long *)(pQVar4 + 2);
      this_03 = (QBrush *)&painterPath;
      local_88.m_matrix[0][2]._4_4_ = uVar14;
      QPen::brush((QPen *)this_03);
      (*(this->super_QPaintEngine)._vptr_QPaintEngine[0x1a])(this,this_02,this_03);
    }
    QBrush::~QBrush(this_03);
    QVectorPath::~QVectorPath(this_02);
  }
LAB_0037e9ea:
  QPen::~QPen(&pen);
LAB_0037e9f4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
code_r0x0037e4a3:
  if (EVar2 == MoveToElement) {
    QStrokerOps::moveTo((QStrokerOps *)pQVar3[3].systemClip.d,p->xp,p->yp);
LAB_0037e515:
    p = p + 1;
    pEVar26 = pEVar26 + 1;
  }
  goto LAB_0037e48c;
code_r0x0037e64b:
  if (EVar2 == MoveToElement) {
    pQVar20 = (this->super_QPaintEngine).state;
    pQVar19 = pQVar20 + -2;
    if (pQVar20 == (QPaintEngineState *)0x0) {
      pQVar19 = (QPaintEngineState *)0x0;
    }
    QVar36 = QTransform::map((QTransform *)(pQVar19 + 0x36),p);
    QStrokerOps::moveTo((QStrokerOps *)pQVar3[3].systemClip.d,QVar36.xp,QVar36.yp);
LAB_0037e761:
    p = p + 1;
    pEVar26 = pEVar26 + 1;
  }
  goto LAB_0037e630;
}

Assistant:

void QPaintEngineEx::stroke(const QVectorPath &path, const QPen &inPen)
{
#ifdef QT_DEBUG_DRAW
    qDebug() << "QPaintEngineEx::stroke()" << inPen;
#endif

    Q_D(QPaintEngineEx);

    if (path.isEmpty())
        return;

    if (!d->strokeHandler) {
        d->strokeHandler = new StrokeHandler(path.elementCount()+4);
        d->stroker.setMoveToHook(qpaintengineex_moveTo);
        d->stroker.setLineToHook(qpaintengineex_lineTo);
        d->stroker.setCubicToHook(qpaintengineex_cubicTo);
    }

    QRectF clipRect;
    QPen pen = inPen;
    if (pen.style() > Qt::SolidLine) {
        QRectF cpRect = path.controlPointRect();
        const QTransform &xf = state()->matrix;
        if (pen.isCosmetic()) {
            clipRect = d->exDeviceRect;
            cpRect.translate(xf.dx(), xf.dy());
        } else {
            clipRect = xf.inverted().mapRect(QRectF(d->exDeviceRect));
        }
        // Check to avoid generating unwieldy amount of dashes that will not be visible anyway
        qreal pw = pen.widthF() ? pen.widthF() : 1;
        QRectF extentRect = cpRect.adjusted(-pw, -pw, pw, pw) & clipRect;
        qreal extent = qMax(extentRect.width(), extentRect.height());
        qreal patternLength = 0;
        const QList<qreal> pattern = pen.dashPattern();
        const int patternSize = qMin(pattern.size(), 32);
        for (int i = 0; i < patternSize; i++)
            patternLength += qMax(pattern.at(i), qreal(0));
        patternLength *= pw;
        if (qFuzzyIsNull(patternLength)) {
            pen.setStyle(Qt::NoPen);
        } else if (extent / patternLength > QDashStroker::repetitionLimit()) {
            // approximate stream of tiny dashes with semi-transparent solid line
            pen.setStyle(Qt::SolidLine);
            QColor color(pen.color());
            color.setAlpha(color.alpha() / 2);
            pen.setColor(color);
        }
    }

    if (!qpen_fast_equals(pen, d->strokerPen)) {
        d->strokerPen = pen;
        d->stroker.setJoinStyle(pen.joinStyle());
        d->stroker.setCapStyle(pen.capStyle());
        d->stroker.setMiterLimit(pen.miterLimit());
        qreal penWidth = pen.widthF();
        if (penWidth == 0)
            d->stroker.setStrokeWidth(1);
        else
            d->stroker.setStrokeWidth(penWidth);

        Qt::PenStyle style = pen.style();
        if (style == Qt::SolidLine) {
            d->activeStroker = &d->stroker;
        } else if (style == Qt::NoPen) {
            d->activeStroker = nullptr;
        } else {
            d->dasher.setDashPattern(pen.dashPattern());
            d->dasher.setDashOffset(pen.dashOffset());
            d->activeStroker = &d->dasher;
        }
    }

    if (!d->activeStroker) {
        return;
    }

    if (!clipRect.isNull())
        d->activeStroker->setClipRect(clipRect);

    if (d->activeStroker == &d->stroker)
        d->stroker.setForceOpen(path.hasExplicitOpen());

    const QPainterPath::ElementType *types = path.elements();
    const qreal *points = path.points();
    int pointCount = path.elementCount();

    const qreal *lastPoint = points + (pointCount<<1);

    d->strokeHandler->types.reset();
    d->strokeHandler->pts.reset();

    // Some engines might decide to optimize for the non-shape hint later on...
    uint flags = QVectorPath::WindingFill;

    if (path.elementCount() > 2)
        flags |= QVectorPath::NonConvexShapeMask;

    if (d->stroker.capStyle() == Qt::RoundCap || d->stroker.joinStyle() == Qt::RoundJoin)
        flags |= QVectorPath::CurvedShapeMask;

    // ### Perspective Xforms are currently not supported...
    if (!pen.isCosmetic()) {
        // We include cosmetic pens in this case to avoid having to
        // change the current transform. Normal transformed,
        // non-cosmetic pens will be transformed as part of fill
        // later, so they are also covered here..
        d->activeStroker->setCurveThresholdFromTransform(state()->matrix);
        d->activeStroker->begin(d->strokeHandler);
        if (types) {
            while (points < lastPoint) {
                switch (*types) {
                case QPainterPath::MoveToElement:
                    d->activeStroker->moveTo(points[0], points[1]);
                    points += 2;
                    ++types;
                    break;
                case QPainterPath::LineToElement:
                    d->activeStroker->lineTo(points[0], points[1]);
                    points += 2;
                    ++types;
                    break;
                case QPainterPath::CurveToElement:
                    d->activeStroker->cubicTo(points[0], points[1],
                                              points[2], points[3],
                                              points[4], points[5]);
                    points += 6;
                    types += 3;
                    flags |= QVectorPath::CurvedShapeMask;
                    break;
                default:
                    break;
                }
            }
            if (path.hasImplicitClose())
                d->activeStroker->lineTo(path.points()[0], path.points()[1]);

        } else {
            d->activeStroker->moveTo(points[0], points[1]);
            points += 2;
            while (points < lastPoint) {
                d->activeStroker->lineTo(points[0], points[1]);
                points += 2;
            }
            if (path.hasImplicitClose())
                d->activeStroker->lineTo(path.points()[0], path.points()[1]);
        }
        d->activeStroker->end();

        if (!d->strokeHandler->types.size()) // an empty path...
            return;

        QVectorPath strokePath(d->strokeHandler->pts.data(),
                               d->strokeHandler->types.size(),
                               d->strokeHandler->types.data(),
                               flags);
        fill(strokePath, pen.brush());
    } else {
        // For cosmetic pens we need a bit of trickery... We to process xform the input points
        if (state()->matrix.type() >= QTransform::TxProject) {
            QPainterPath painterPath = state()->matrix.map(path.convertToPainterPath());
            d->activeStroker->strokePath(painterPath, d->strokeHandler, QTransform());
        } else {
            d->activeStroker->setCurveThresholdFromTransform(QTransform());
            d->activeStroker->begin(d->strokeHandler);
            if (types) {
                while (points < lastPoint) {
                    switch (*types) {
                    case QPainterPath::MoveToElement: {
                        QPointF pt = (*(const QPointF *) points) * state()->matrix;
                        d->activeStroker->moveTo(pt.x(), pt.y());
                        points += 2;
                        ++types;
                        break;
                    }
                    case QPainterPath::LineToElement: {
                        QPointF pt = (*(const QPointF *) points) * state()->matrix;
                        d->activeStroker->lineTo(pt.x(), pt.y());
                        points += 2;
                        ++types;
                        break;
                    }
                    case QPainterPath::CurveToElement: {
                        QPointF c1 = ((const QPointF *) points)[0] * state()->matrix;
                        QPointF c2 = ((const QPointF *) points)[1] * state()->matrix;
                        QPointF e =  ((const QPointF *) points)[2] * state()->matrix;
                        d->activeStroker->cubicTo(c1.x(), c1.y(), c2.x(), c2.y(), e.x(), e.y());
                        points += 6;
                        types += 3;
                        flags |= QVectorPath::CurvedShapeMask;
                        break;
                    }
                    default:
                        break;
                    }
                }
                if (path.hasImplicitClose()) {
                    QPointF pt = * ((const QPointF *) path.points()) * state()->matrix;
                    d->activeStroker->lineTo(pt.x(), pt.y());
                }

            } else {
                QPointF p = ((const QPointF *)points)[0] * state()->matrix;
                d->activeStroker->moveTo(p.x(), p.y());
                points += 2;
                while (points < lastPoint) {
                    QPointF p = ((const QPointF *)points)[0] * state()->matrix;
                    d->activeStroker->lineTo(p.x(), p.y());
                    points += 2;
                }
                if (path.hasImplicitClose())
                    d->activeStroker->lineTo(p.x(), p.y());
            }
            d->activeStroker->end();
        }

        QVectorPath strokePath(d->strokeHandler->pts.data(),
                               d->strokeHandler->types.size(),
                               d->strokeHandler->types.data(),
                               flags);

        QTransform xform = state()->matrix;
        state()->matrix = QTransform();
        transformChanged();

        QBrush brush = pen.brush();
        if (qbrush_style(brush) != Qt::SolidPattern)
            brush.setTransform(brush.transform() * xform);

        fill(strokePath, brush);

        state()->matrix = xform;
        transformChanged();
    }
}